

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O3

uint128_t __thiscall
farmhashcc::CityHash128WithSeed(farmhashcc *this,char *s,size_t len,uint128_t seed)

{
  farmhashcc *pfVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long *plVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  farmhashcc *pfVar22;
  uint128_t uVar23;
  
  uVar20 = seed.first;
  if (s < (char *)0x80) {
    if (s < (char *)0x11) {
      lVar15 = -0x651e95c4d06fbfb1;
      uVar13 = (len * -0x4b6d499041670d8d >> 0x2f ^ len * -0x4b6d499041670d8d) * -0x4b6d499041670d8d
      ;
      if (s < (char *)0x8) {
        if (s < (char *)0x4) {
          if (s != (char *)0x0) {
            uVar11 = ((ulong)(byte)(this + -1)[(long)s] << 2 | (ulong)s) * -0x3c5a37a36834ced9 ^
                     (ulong)CONCAT11(this[(ulong)s >> 1],*this) * -0x651e95c4d06fbfb1;
            lVar15 = (uVar11 >> 0x2f ^ uVar11) * -0x651e95c4d06fbfb1;
          }
        }
        else {
          lVar15 = (long)s * 2 + -0x651e95c4d06fbfb1;
          uVar11 = ((ulong)(s + (ulong)*(uint *)this * 8) ^ (ulong)*(uint *)(this + -4 + (long)s)) *
                   lVar15;
          uVar11 = (uVar11 >> 0x2f ^ *(uint *)(this + -4 + (long)s) ^ uVar11) * lVar15;
          lVar15 = (uVar11 >> 0x2f ^ uVar11) * lVar15;
        }
        uVar19 = lVar15 + uVar20 * -0x4b6d499041670d8d;
        uVar11 = uVar19;
      }
      else {
        lVar15 = (long)s * 2 + -0x651e95c4d06fbfb1;
        uVar11 = *(ulong *)(this + -8 + (long)s);
        uVar19 = *(ulong *)this;
        uVar16 = uVar19 + 0x9ae16a3b2f90404f;
        uVar17 = ((uVar16 >> 0x19 | uVar16 << 0x27) + uVar11) * lVar15;
        uVar11 = ((uVar11 >> 0x25 | uVar11 << 0x1b) * lVar15 + uVar16 ^ uVar17) * lVar15;
        uVar11 = (uVar11 >> 0x2f ^ uVar17 ^ uVar11) * lVar15;
        uVar11 = (uVar11 >> 0x2f ^ uVar11) * lVar15 + uVar20 * -0x4b6d499041670d8d;
      }
      uVar19 = uVar19 + uVar13 >> 0x2f ^ uVar19 + uVar13;
    }
    else {
      pcVar9 = s + 0x10;
      uVar11 = (*(long *)(this + -8 + (long)s) + 0xb492b66fbe98f273U ^ len) * -0x622015f714c7d297;
      uVar11 = (uVar11 >> 0x2f ^ len ^ uVar11) * -0x622015f714c7d297;
      uVar11 = (uVar11 >> 0x2f ^ uVar11) * -0x622015f714c7d297;
      uVar13 = ((ulong)(s + uVar20) ^ *(long *)(this + -0x10 + (long)s) + uVar11) *
               -0x622015f714c7d297;
      uVar13 = (uVar13 >> 0x2f ^ *(long *)(this + -0x10 + (long)s) + uVar11 ^ uVar13) *
               -0x622015f714c7d297;
      uVar19 = (uVar13 >> 0x2f ^ uVar13) * -0x622015f714c7d297;
      uVar13 = len + uVar19;
      do {
        lVar15 = *(long *)this;
        pcVar9 = pcVar9 + -0x10;
        pfVar22 = this + 8;
        this = this + 0x10;
        uVar13 = (((ulong)(lVar15 * -0x4b6d499041670d8d) >> 0x2f ^ lVar15 * -0x4b6d499041670d8d) *
                  -0x4b6d499041670d8d ^ uVar13) * -0x4b6d499041670d8d;
        uVar20 = uVar20 ^ uVar13;
        uVar11 = (((ulong)(*(long *)pfVar22 * -0x4b6d499041670d8d) >> 0x2f ^
                  *(long *)pfVar22 * -0x4b6d499041670d8d) * -0x4b6d499041670d8d ^ uVar11) *
                 -0x4b6d499041670d8d;
        uVar19 = uVar19 ^ uVar11;
      } while ((char *)0x20 < pcVar9);
    }
    uVar13 = (uVar13 ^ uVar11) * -0x622015f714c7d297;
    uVar19 = (uVar19 ^ uVar20) * -0x622015f714c7d297;
    uVar11 = (uVar13 >> 0x2f ^ uVar11 ^ uVar13) * -0x622015f714c7d297;
    uVar20 = (uVar19 >> 0x2f ^ uVar20 ^ uVar19) * -0x622015f714c7d297;
    uVar13 = (uVar11 >> 0x2f ^ uVar11) * -0x622015f714c7d297;
    uVar11 = (uVar20 >> 0x2f ^ uVar20) * -0x622015f714c7d297 ^ uVar13;
    uVar20 = uVar11;
  }
  else {
    uVar16 = (long)s * -0x4b6d499041670d8d;
    uVar13 = ((uVar20 ^ 0xb492b66fbe98f273) >> 0x31 | (uVar20 ^ 0xb492b66fbe98f273) << 0xf) *
             -0x4b6d499041670d8d + *(long *)this;
    uVar19 = (*(long *)(this + 0x58) + len >> 0x35 | (*(long *)(this + 0x58) + len) * 0x800) *
             -0x4b6d499041670d8d;
    lVar15 = (uVar13 >> 0x2a | uVar13 * 0x400000) * -0x4b6d499041670d8d + *(long *)(this + 8);
    uVar11 = (uVar16 + uVar20 >> 0x23 | (uVar16 + uVar20) * 0x20000000) * -0x4b6d499041670d8d + len;
    pfVar22 = this + 0x78;
    pcVar9 = s;
    do {
      pcVar9 = pcVar9 + -0x80;
      lVar14 = lVar15 * -0x4b6d499041670d8d + *(long *)(pfVar22 + -0x78);
      uVar17 = uVar20 + lVar15 + *(long *)(pfVar22 + -0x48);
      uVar20 = len + uVar13 + uVar20 + *(long *)(pfVar22 + -0x70);
      uVar6 = *(long *)(pfVar22 + -0x70) + lVar14 + *(long *)(pfVar22 + -0x68);
      lVar5 = uVar13 + *(long *)(pfVar22 + -0x50) +
              (uVar17 >> 0x2a | uVar17 * 0x400000) * -0x4b6d499041670d8d;
      uVar13 = (uVar20 >> 0x25 | uVar20 * 0x8000000) * -0x4b6d499041670d8d ^ uVar19;
      lVar15 = (uVar16 + uVar11 >> 0x21 | (uVar16 + uVar11) * 0x80000000) * -0x4b6d499041670d8d;
      lVar18 = uVar19 + lVar15 + *(long *)(pfVar22 + -0x58);
      lVar7 = uVar6 + *(long *)(pfVar22 + -0x60);
      uVar20 = uVar11 + lVar14 + *(long *)(pfVar22 + -0x60) + uVar13;
      lVar12 = (uVar6 >> 0x2c | uVar6 * 0x100000) + lVar14 + (uVar20 >> 0x15 | uVar20 << 0x2b);
      uVar11 = lVar15 + lVar7 + *(long *)(pfVar22 + -0x30) + lVar5;
      uVar19 = *(long *)(pfVar22 + -0x50) + *(long *)(pfVar22 + -0x48) + lVar18;
      uVar20 = *(long *)(pfVar22 + -0x68) + lVar18 + lVar5 + *(long *)(pfVar22 + -0x40);
      lVar21 = uVar19 + *(long *)(pfVar22 + -0x40);
      uVar13 = uVar13 + lVar21;
      uVar20 = (uVar19 >> 0x2c | uVar19 * 0x100000) + lVar18 + (uVar20 >> 0x15 | uVar20 << 0x2b);
      pfVar1 = pfVar22 + -0x28;
      len = (uVar13 >> 0x21 | uVar13 * 0x80000000) * -0x4b6d499041670d8d;
      uVar16 = (uVar11 >> 0x25 | uVar11 * 0x8000000) * -0x4b6d499041670d8d ^ uVar20;
      lVar14 = uVar20 + len + *(long *)(pfVar22 + -0x18);
      uVar20 = lVar5 + *(long *)(pfVar22 + -8) + lVar12;
      lVar15 = lVar12 * -0x4b6d499041670d8d + *(long *)(pfVar22 + -0x38);
      uVar17 = *(long *)(pfVar22 + -0x10) + *(long *)(pfVar22 + -8) + lVar14;
      uVar11 = *(long *)(pfVar22 + -0x30) + *(long *)pfVar1 + lVar15;
      uVar20 = lVar7 + *(long *)(pfVar22 + -0x10) +
               (uVar20 >> 0x2a | uVar20 * 0x400000) * -0x4b6d499041670d8d;
      uVar13 = uVar11 + *(long *)(pfVar22 + -0x20);
      uVar19 = lVar21 + uVar16 + *(long *)(pfVar22 + -0x20) + lVar15;
      lVar5 = *(long *)pfVar22;
      pfVar22 = pfVar22 + 0x80;
      lVar15 = (uVar11 >> 0x2c | uVar11 * 0x100000) + lVar15 + (uVar19 >> 0x15 | uVar19 << 0x2b);
      uVar11 = uVar17 + lVar5;
      uVar19 = *(long *)pfVar1 + uVar20 + lVar5 + lVar14;
      uVar19 = (uVar17 >> 0x2c | uVar17 * 0x100000) + lVar14 + (uVar19 >> 0x15 | uVar19 << 0x2b);
    } while ((char *)0x7f < pcVar9);
    uVar17 = uVar13 * -0x3c5a37a36834ced9;
    lVar5 = (uVar11 >> 0x1b | uVar11 << 0x25) + uVar16 * -0x3c5a37a36834ced9;
    uVar13 = (uVar13 + uVar16 >> 0x31 | (uVar13 + uVar16) * 0x8000) * -0x3c5a37a36834ced9 + len;
    lVar14 = (uVar19 >> 0x25 | uVar19 * 0x8000000) + uVar20 * -0x3c5a37a36834ced9;
    uVar11 = uVar11 * 9;
    if (pcVar9 != (char *)0x0) {
      plVar8 = (long *)(s + -8 + (long)this);
      pcVar10 = (char *)0x0;
      do {
        plVar2 = plVar8 + -1;
        plVar3 = plVar8 + -3;
        lVar7 = *plVar8;
        lVar5 = lVar5 + uVar19;
        uVar19 = uVar19 + uVar17;
        pcVar10 = pcVar10 + 0x20;
        uVar11 = uVar11 + *plVar2;
        plVar4 = plVar8 + -2;
        lVar5 = lVar5 + *plVar3;
        lVar14 = (lVar14 + uVar13 >> 0x2a | (lVar14 + uVar13) * 0x400000) * -0x3c5a37a36834ced9 +
                 lVar15;
        plVar8 = plVar8 + -4;
        lVar12 = *plVar3 + uVar17 + lVar5;
        uVar13 = uVar13 * -0x3c5a37a36834ced9 + uVar11;
        uVar16 = lVar15 + lVar7 + lVar12;
        uVar20 = *plVar2 + *plVar4 + lVar12;
        uVar17 = (uVar20 + lVar7) * -0x3c5a37a36834ced9;
        lVar15 = (uVar20 >> 0x2c | uVar20 * 0x100000) + lVar12 + (uVar16 >> 0x15 | uVar16 << 0x2b);
      } while (pcVar10 < pcVar9);
    }
    uVar13 = (uVar13 ^ uVar17) * -0x622015f714c7d297;
    uVar20 = (lVar5 + lVar14 ^ uVar11) * -0x622015f714c7d297;
    uVar13 = (uVar13 >> 0x2f ^ uVar17 ^ uVar13) * -0x622015f714c7d297;
    uVar20 = (uVar20 >> 0x2f ^ uVar11 ^ uVar20) * -0x622015f714c7d297;
    lVar5 = (uVar13 >> 0x2f ^ uVar13) * -0x622015f714c7d297;
    uVar20 = uVar20 >> 0x2f ^ uVar20;
    uVar11 = (lVar5 + lVar15 ^ uVar19) * -0x622015f714c7d297;
    uVar11 = (uVar11 >> 0x2f ^ uVar19 ^ uVar11) * -0x622015f714c7d297;
    uVar11 = ((uVar11 >> 0x2f ^ uVar11) + uVar20) * -0x622015f714c7d297;
    uVar13 = uVar20 * -0x622015f714c7d297 + lVar15;
    uVar20 = lVar5 + uVar19 ^ uVar13;
  }
  uVar20 = (uVar20 * -0x622015f714c7d297 >> 0x2f ^ uVar13 ^ uVar20 * -0x622015f714c7d297) *
           -0x622015f714c7d297;
  uVar23.second = (uVar20 >> 0x2f ^ uVar20) * -0x622015f714c7d297;
  uVar23.first = uVar11;
  return uVar23;
}

Assistant:

uint128_t CityHash128WithSeed(const char *s, size_t len, uint128_t seed) {
  if (len < 128) {
    return CityMurmur(s, len, seed);
  }

  // We expect len >= 128 to be the common case.  Keep 56 bytes of state:
  // v, w, x, y, and z.
  pair<uint64_t, uint64_t> v, w;
  uint64_t x = Uint128Low64(seed);
  uint64_t y = Uint128High64(seed);
  uint64_t z = len * k1;
  v.first = Rotate(y ^ k1, 49) * k1 + Fetch(s);
  v.second = Rotate(v.first, 42) * k1 + Fetch(s + 8);
  w.first = Rotate(y + z, 35) * k1 + x;
  w.second = Rotate(x + Fetch(s + 88), 53) * k1;

  // This is the same inner loop as CityHash64(), manually unrolled.
  do {
    x = Rotate(x + y + v.first + Fetch(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
    std::swap(z, x);
    s += 64;
    x = Rotate(x + y + v.first + Fetch(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
    std::swap(z, x);
    s += 64;
    len -= 128;
  } while (LIKELY(len >= 128));
  x += Rotate(v.first + z, 49) * k0;
  y = y * k0 + Rotate(w.second, 37);
  z = z * k0 + Rotate(w.first, 27);
  w.first *= 9;
  v.first *= k0;
  // If 0 < len < 128, hash up to 4 chunks of 32 bytes each from the end of s.
  for (size_t tail_done = 0; tail_done < len; ) {
    tail_done += 32;
    y = Rotate(x + y, 42) * k0 + v.second;
    w.first += Fetch(s + len - tail_done + 16);
    x = x * k0 + w.first;
    z += w.second + Fetch(s + len - tail_done);
    w.second += v.first;
    v = WeakHashLen32WithSeeds(s + len - tail_done, v.first + z, v.second);
    v.first *= k0;
  }
  // At this point our 56 bytes of state should contain more than
  // enough information for a strong 128-bit hash.  We use two
  // different 56-byte-to-8-byte hashes to get a 16-byte final result.
  x = HashLen16(x, v.first);
  y = HashLen16(y + z, w.first);
  return uint128_t(HashLen16(x + v.second, w.second) + y,
                   HashLen16(x + w.second, y + v.second));
}